

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O3

void free_timers(level *lev)

{
  timer_element *ptVar1;
  timer_element *__ptr;
  
  __ptr = lev->lev_timers;
  while (__ptr != (timer_element *)0x0) {
    ptVar1 = __ptr->next;
    free(__ptr);
    __ptr = ptVar1;
  }
  lev->lev_timers = (timer_element *)0x0;
  return;
}

Assistant:

void free_timers(struct level *lev)
{
    timer_element *curr, *next = NULL;

    for (curr = lev->lev_timers; curr; curr = next) {
	next = curr->next;
	free(curr);
    }
    lev->lev_timers = NULL;
}